

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::finish_tree(CTcEmbedBuilderDbl *this,CTcPrsNode *cur)

{
  if (cur == (CTcPrsNode *)0x0) {
    cur = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,0);
    CTPNDstr::CTPNDstr((CTPNDstr *)cur,"",0);
  }
  return (CTcPrsNode *)(CTPNDstr *)cur;
}

Assistant:

virtual CTcPrsNode *finish_tree(CTcPrsNode *cur)
    {
        return (cur != 0 ? cur : new CTPNDstr("", 0));
    }